

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_init.inc.c
# Opt level: O1

void ppc_e300_cpu_family_class_init(CPUClass *oc,void *data)

{
  oc[1].cpu_exec_interrupt = init_proc_e300;
  oc[1].adjust_watchpoint_address = check_pow_hid0;
  oc[1].get_memory_mapping = (_func_void_CPUState_ptr_MemoryMappingList_ptr_conflict *)0x70fe0c92201
  ;
  oc[1].synchronize_from_tb = (_func_void_CPUState_ptr_TranslationBlock_ptr_conflict1 *)0x7fff3;
  oc[1].get_phys_page_debug = (_func_hwaddr_CPUState_ptr_vaddr_conflict *)0x500000002;
  oc[1].get_phys_page_attrs_debug =
       (_func_hwaddr_CPUState_ptr_vaddr_MemTxAttrs_ptr_conflict *)0x2009400000001;
  return;
}

Assistant:

POWERPC_FAMILY(e300)(CPUClass *oc, void *data)
{
    PowerPCCPUClass *pcc = POWERPC_CPU_CLASS(oc);

//    dc->desc = "e300 core";
    pcc->init_proc = init_proc_e300;
    pcc->check_pow = check_pow_hid0;
    pcc->insns_flags = PPC_INSNS_BASE | PPC_STRING | PPC_MFTB |
                       PPC_FLOAT | PPC_FLOAT_FSEL | PPC_FLOAT_FRES |
                       PPC_FLOAT_STFIWX |
                       PPC_CACHE | PPC_CACHE_ICBI | PPC_CACHE_DCBZ |
                       PPC_MEM_SYNC | PPC_MEM_EIEIO |
                       PPC_MEM_TLBIE | PPC_MEM_TLBSYNC | PPC_6xx_TLB |
                       PPC_SEGMENT | PPC_EXTERN;
    pcc->msr_mask = (1ull << MSR_POW) |
                    (1ull << MSR_TGPR) |
                    (1ull << MSR_ILE) |
                    (1ull << MSR_EE) |
                    (1ull << MSR_PR) |
                    (1ull << MSR_FP) |
                    (1ull << MSR_ME) |
                    (1ull << MSR_FE0) |
                    (1ull << MSR_SE) |
                    (1ull << MSR_DE) |
                    (1ull << MSR_FE1) |
                    (1ull << MSR_AL) |
                    (1ull << MSR_EP) |
                    (1ull << MSR_IR) |
                    (1ull << MSR_DR) |
                    (1ull << MSR_RI) |
                    (1ull << MSR_LE);
    pcc->mmu_model = POWERPC_MMU_SOFT_6xx;
    pcc->excp_model = POWERPC_EXCP_603;
    pcc->bus_model = PPC_FLAGS_INPUT_6xx;
    pcc->flags = POWERPC_FLAG_TGPR | POWERPC_FLAG_SE |
                 POWERPC_FLAG_BE | POWERPC_FLAG_BUS_CLK;
}